

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> * __thiscall
Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::operator=
          (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *this,
          VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *obj)

{
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *pIVar1;
  undefined8 *in_RSI;
  VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *in_RDI;
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *oldCore;
  
  pIVar1 = in_RDI->_core;
  in_RDI->_core = (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)*in_RSI;
  if (in_RDI->_core != (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x0) {
    in_RDI->_core->_refCnt = in_RDI->_core->_refCnt + 1;
  }
  if (((pIVar1 != (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x0) &&
      (pIVar1->_refCnt = pIVar1->_refCnt + -1, pIVar1->_refCnt == 0)) &&
     (pIVar1 != (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x0)) {
    (*pIVar1->_vptr_IteratorCore[1])();
  }
  return in_RDI;
}

Assistant:

VirtualIterator& operator=(const VirtualIterator& obj)
  {
    IteratorCore<T>* oldCore=_core;
    _core=obj._core;
    if(_core) {
      _core->_refCnt++;
    }
    if(oldCore) {
      oldCore->_refCnt--;
      if(!oldCore->_refCnt) {
	delete oldCore;
      }
    }
    return *this;
  }